

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O0

ModulusPoly * __thiscall ZXing::Pdf417::ModulusPoly::negative(ModulusPoly *this)

{
  ModulusGF *pMVar1;
  reference pvVar2;
  ModulusPoly *in_RSI;
  ModulusPoly *in_RDI;
  size_t i;
  vector<int,_std::allocator<int>_> negativeCoefficients;
  size_t size;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  ModulusGF *local_50;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  ModulusGF *field;
  ModulusPoly *this_00;
  
  this_00 = in_RSI;
  pMVar1 = (ModulusGF *)std::vector<int,_std::allocator<int>_>::size(&in_RSI->_coefficients);
  field = pMVar1;
  std::allocator<int>::allocator((allocator<int> *)0x2caf02);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)pMVar1,(size_type)in_RSI,(allocator_type *)in_RDI)
  ;
  std::allocator<int>::~allocator((allocator<int> *)0x2caf22);
  for (local_50 = (ModulusGF *)0x0; local_50 < field;
      local_50 = (ModulusGF *)((long)&local_50->_modulus + 1)) {
    pMVar1 = in_RSI->_field;
    std::vector<int,_std::allocator<int>_>::operator[](&in_RSI->_coefficients,(size_type)local_50);
    in_stack_ffffffffffffff84 =
         ModulusGF::subtract((ModulusGF *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             (int)((ulong)pMVar1 >> 0x20),(int)pMVar1);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffd0,
                        (size_type)local_50);
    *pvVar2 = in_stack_ffffffffffffff84;
  }
  ModulusPoly(this_00,field,in_stack_ffffffffffffffe0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  return in_RDI;
}

Assistant:

ModulusPoly
ModulusPoly::negative() const
{
	size_t size = _coefficients.size();
	std::vector<int> negativeCoefficients(size);
	for (size_t i = 0; i < size; i++) {
		negativeCoefficients[i] = _field->subtract(0, _coefficients[i]);
	}
	return ModulusPoly(*_field, negativeCoefficients);
}